

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderLoopTests.cpp
# Opt level: O1

int __thiscall
vkt::sr::anon_unknown_0::ShaderLoopTests::init(ShaderLoopTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  DataType dataType;
  char *__s;
  TestContext *pTVar2;
  LoopCountType loopCountType;
  int iVar3;
  TestNode *node;
  TestNode *node_00;
  long *plVar4;
  undefined8 *puVar5;
  TestNode *node_01;
  ostream *poVar6;
  size_t sVar7;
  LoopUniformSetup *this_00;
  TestNode *node_02;
  long lVar8;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  long *plVar12;
  string *psVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  undefined8 uVar17;
  _Base_ptr p_Var18;
  Precision precision;
  string *psVar19;
  _Alloc_hider _Var20;
  long lVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string iterMaxStr;
  string loopBody;
  StringTemplate fragTemplate;
  string initValue;
  string loopCountDeclStr;
  allocator<char> local_68a;
  allocator<char> local_689;
  string vertexShaderSource;
  vector<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_> uniformInformations;
  StringTemplate vertTemplate;
  _Alloc_hider local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618 [4];
  ios_base local_5d8 [264];
  TestNode *local_4d0;
  ShaderLoopTests *local_4c8;
  long local_4c0;
  string local_4b8;
  string incrementStr;
  string loopCmpStr;
  string groupDesc;
  string groupName;
  string testDesc;
  string testName;
  string local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  ostringstream vtx;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310 [6];
  ios_base local_2b0 [264];
  ostringstream frag;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"generic",
             "Generic loop tests.");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"special"
             ,"Special loop tests.");
  tcu::TestNode::addChild((TestNode *)this,node);
  local_4c8 = this;
  tcu::TestNode::addChild((TestNode *)this,node_00);
  local_4c0 = 0;
  do {
    __s = (char *)(&sr::(anonymous_namespace)::
                    getLoopTypeName(vkt::sr::(anonymous_namespace)::LoopType)::s_names)[local_4c0];
    lVar8 = 0;
    do {
      pcVar14 = (char *)(&sr::(anonymous_namespace)::
                          getLoopCountTypeName(vkt::sr::(anonymous_namespace)::LoopCountType)::
                          s_names)[lVar8];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frag,__s,(allocator<char> *)&iterMaxStr);
      plVar4 = (long *)std::__cxx11::string::append((char *)&frag);
      _vtx = (pointer)local_310;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar10) {
        local_310[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_310[0]._8_8_ = plVar4[3];
      }
      else {
        local_310[0]._0_8_ = paVar10->_M_allocated_capacity;
        _vtx = (pointer)*plVar4;
      }
      lVar23 = plVar4[1];
      *plVar4 = (long)paVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,pcVar14,(allocator<char> *)&initValue);
      uVar17 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_vtx != local_310) {
        uVar17 = local_310[0]._M_allocated_capacity;
      }
      if ((ulong)uVar17 <
          (_Base_ptr)(params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + lVar23)) {
        p_Var18 = (_Base_ptr)0xf;
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          p_Var18 = params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
        if (p_Var18 < (_Base_ptr)
                      (params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + lVar23))
        goto LAB_0058d25e;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&params,0,(char *)0x0,(ulong)_vtx);
      }
      else {
LAB_0058d25e:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&vtx,params._M_t._M_impl._0_8_);
      }
      vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
      psVar11 = puVar5 + 2;
      if ((size_type *)*puVar5 == psVar11) {
        vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
        vertTemplate.m_template.field_2._8_8_ = puVar5[3];
      }
      else {
        vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
        vertTemplate.m_template._M_dataplus._M_p = (pointer)*puVar5;
      }
      vertTemplate.m_template._M_string_length = puVar5[1];
      *puVar5 = psVar11;
      puVar5[1] = 0;
      *(char *)psVar11 = '\0';
      plVar4 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
      groupName._M_dataplus._M_p = (pointer)&groupName.field_2;
      psVar11 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar11) {
        groupName.field_2._M_allocated_capacity = *psVar11;
        groupName.field_2._8_8_ = plVar4[3];
      }
      else {
        groupName.field_2._M_allocated_capacity = *psVar11;
        groupName._M_dataplus._M_p = (pointer)*plVar4;
      }
      groupName._M_string_length = plVar4[1];
      *plVar4 = (long)psVar11;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
        operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                        vertTemplate.m_template.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
          &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_vtx != local_310) {
        operator_delete(_vtx,(ulong)(local_310[0]._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_frag != local_198) {
        operator_delete(_frag,local_198[0]._M_allocated_capacity + 1);
      }
      _vtx = (pointer)local_310;
      std::__cxx11::string::_M_construct<char_const*>((string *)&vtx,"Loop tests with ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)&vtx);
      vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
      psVar11 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar11) {
        vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
        vertTemplate.m_template.field_2._8_8_ = plVar4[3];
      }
      else {
        vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
        vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
      }
      vertTemplate.m_template._M_string_length = plVar4[1];
      *plVar4 = (long)psVar11;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
      groupDesc._M_dataplus._M_p = (pointer)&groupDesc.field_2;
      psVar11 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar11) {
        groupDesc.field_2._M_allocated_capacity = *psVar11;
        groupDesc.field_2._8_8_ = plVar4[3];
      }
      else {
        groupDesc.field_2._M_allocated_capacity = *psVar11;
        groupDesc._M_dataplus._M_p = (pointer)*plVar4;
      }
      groupDesc._M_string_length = plVar4[1];
      *plVar4 = (long)psVar11;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
        operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                        vertTemplate.m_template.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_vtx != local_310) {
        operator_delete(_vtx,(ulong)(local_310[0]._M_allocated_capacity + 1));
      }
      node_01 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node_01,(local_4c8->super_TestCaseGroup).super_TestNode.m_testCtx,
                 groupName._M_dataplus._M_p,groupDesc._M_dataplus._M_p);
      local_4d0 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_4d0,
                 (local_4c8->super_TestCaseGroup).super_TestNode.m_testCtx,
                 groupName._M_dataplus._M_p,groupDesc._M_dataplus._M_p);
      tcu::TestNode::addChild(node,node_01);
      tcu::TestNode::addChild(node_00,local_4d0);
      loopCountType = (LoopCountType)lVar8;
      precision = PRECISION_MEDIUMP;
      do {
        glu::getPrecisionName(precision);
        lVar23 = 0;
        do {
          dataType = init::s_countDataType[lVar23];
          glu::getDataTypeName(dataType);
          uVar9 = dataType - TYPE_INT;
          lVar22 = 0;
          do {
            glu::getShaderTypeName(*(ShaderType *)((long)init::s_shaderTypes + lVar22));
            iterMaxStr._M_dataplus._M_p = (pointer)&iterMaxStr.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&iterMaxStr,"basic_","");
            plVar4 = (long *)std::__cxx11::string::append((char *)&iterMaxStr);
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar12 = plVar4 + 2;
            if ((long *)*plVar4 == plVar12) {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar4[3];
            }
            else {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
              params._M_t._M_impl._0_8_ = (long *)*plVar4;
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar4[1];
            *plVar4 = (long)plVar12;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&params);
            _frag = (pointer)local_198;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar10) {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar4[3];
            }
            else {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              _frag = (pointer)*plVar4;
            }
            *plVar4 = (long)paVar10;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&frag);
            _vtx = (pointer)local_310;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar10) {
              local_310[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_310[0]._8_8_ = plVar4[3];
            }
            else {
              local_310[0]._0_8_ = paVar10->_M_allocated_capacity;
              _vtx = (pointer)*plVar4;
            }
            *plVar4 = (long)paVar10;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&vtx);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar11 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar11) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
              vertTemplate.m_template.field_2._8_8_ = plVar4[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
            }
            vertTemplate.m_template._M_string_length = plVar4[1];
            *plVar4 = (long)psVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
            testName._M_dataplus._M_p = (pointer)&testName.field_2;
            psVar11 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar11) {
              testName.field_2._M_allocated_capacity = *psVar11;
              testName.field_2._8_8_ = plVar4[3];
            }
            else {
              testName.field_2._M_allocated_capacity = *psVar11;
              testName._M_dataplus._M_p = (pointer)*plVar4;
            }
            testName._M_string_length = plVar4[1];
            *plVar4 = (long)psVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_vtx != local_310) {
              operator_delete(_vtx,local_310[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_frag != local_198) {
              operator_delete(_frag,local_198[0]._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)iterMaxStr._M_dataplus._M_p != &iterMaxStr.field_2) {
              operator_delete(iterMaxStr._M_dataplus._M_p,
                              iterMaxStr.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&loopCmpStr,__s,(allocator<char> *)&incrementStr);
            plVar4 = (long *)std::__cxx11::string::append((char *)&loopCmpStr);
            loopCountDeclStr._M_dataplus._M_p = (pointer)&loopCountDeclStr.field_2;
            psVar11 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar11) {
              loopCountDeclStr.field_2._M_allocated_capacity = *psVar11;
              loopCountDeclStr.field_2._8_8_ = plVar4[3];
            }
            else {
              loopCountDeclStr.field_2._M_allocated_capacity = *psVar11;
              loopCountDeclStr._M_dataplus._M_p = (pointer)*plVar4;
            }
            loopCountDeclStr._M_string_length = plVar4[1];
            *plVar4 = (long)psVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&loopCountDeclStr);
            initValue._M_dataplus._M_p = (pointer)&initValue.field_2;
            psVar11 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar11) {
              initValue.field_2._M_allocated_capacity = *psVar11;
              initValue.field_2._8_8_ = plVar4[3];
            }
            else {
              initValue.field_2._M_allocated_capacity = *psVar11;
              initValue._M_dataplus._M_p = (pointer)*plVar4;
            }
            initValue._M_string_length = plVar4[1];
            *plVar4 = (long)psVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&initValue);
            iterMaxStr._M_dataplus._M_p = (pointer)&iterMaxStr.field_2;
            psVar11 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar11) {
              iterMaxStr.field_2._M_allocated_capacity = *psVar11;
              iterMaxStr.field_2._8_8_ = plVar4[3];
            }
            else {
              iterMaxStr.field_2._M_allocated_capacity = *psVar11;
              iterMaxStr._M_dataplus._M_p = (pointer)*plVar4;
            }
            iterMaxStr._M_string_length = plVar4[1];
            *plVar4 = (long)psVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&iterMaxStr);
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar12 = plVar4 + 2;
            if ((long *)*plVar4 == plVar12) {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar4[3];
            }
            else {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
              params._M_t._M_impl._0_8_ = (long *)*plVar4;
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar4[1];
            *plVar4 = (long)plVar12;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&params);
            _frag = (pointer)local_198;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar10) {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar4[3];
            }
            else {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              _frag = (pointer)*plVar4;
            }
            *plVar4 = (long)paVar10;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&frag);
            _vtx = (pointer)local_310;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar10) {
              local_310[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_310[0]._8_8_ = plVar4[3];
            }
            else {
              local_310[0]._0_8_ = paVar10->_M_allocated_capacity;
              _vtx = (pointer)*plVar4;
            }
            *plVar4 = (long)paVar10;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&vtx);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar11 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar11) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
              vertTemplate.m_template.field_2._8_8_ = plVar4[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
            }
            vertTemplate.m_template._M_string_length = plVar4[1];
            *plVar4 = (long)psVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
            testDesc._M_dataplus._M_p = (pointer)&testDesc.field_2;
            psVar11 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar11) {
              testDesc.field_2._M_allocated_capacity = *psVar11;
              testDesc.field_2._8_8_ = plVar4[3];
            }
            else {
              testDesc.field_2._M_allocated_capacity = *psVar11;
              testDesc._M_dataplus._M_p = (pointer)*plVar4;
            }
            testDesc._M_string_length = plVar4[1];
            *plVar4 = (long)psVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_vtx != local_310) {
              operator_delete(_vtx,(ulong)(local_310[0]._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_frag != local_198) {
              operator_delete(_frag,local_198[0]._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)iterMaxStr._M_dataplus._M_p != &iterMaxStr.field_2) {
              operator_delete(iterMaxStr._M_dataplus._M_p,
                              iterMaxStr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)initValue._M_dataplus._M_p != &initValue.field_2) {
              operator_delete(initValue._M_dataplus._M_p,initValue.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopCountDeclStr._M_dataplus._M_p != &loopCountDeclStr.field_2) {
              operator_delete(loopCountDeclStr._M_dataplus._M_p,
                              loopCountDeclStr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopCmpStr._M_dataplus._M_p != &loopCmpStr.field_2) {
              operator_delete(loopCmpStr._M_dataplus._M_p,
                              loopCmpStr.field_2._M_allocated_capacity + 1);
            }
            pTVar2 = (local_4c8->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_360,testName._M_dataplus._M_p,&local_689);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_380,testDesc._M_dataplus._M_p,&local_68a);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
            psVar13 = (string *)&frag;
            if (lVar22 == 0) {
              psVar13 = (string *)&vtx;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vtx,"#version 310 es\n",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&frag,"#version 310 es\n",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vtx,"layout(location=0) in highp vec4 a_position;\n",0x2d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vtx,"layout(location=1) in highp vec4 a_coords;\n",0x2b);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&frag,"layout(location=0) out mediump vec4 o_color;\n",0x2d);
            if (lVar8 == 2) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location=3) in mediump float a_one;\n",0x2b);
            }
            if (lVar22 == 0) {
              lVar21 = 0x2c;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location=0) out mediump vec3 v_color;\n",0x2d);
              pcVar14 = "layout(location=0) in mediump vec3 v_color;\n";
LAB_0058de89:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar14,lVar21);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location=0) out mediump vec4 v_coords;\n",0x2e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"layout(location=0) in mediump vec4 v_coords;\n",0x2d);
              if (lVar8 == 2) {
                lVar21 = 0x2b;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location=1) out mediump float v_one;\n",0x2c);
                pcVar14 = "layout(location=1) in mediump float v_one;\n";
                goto LAB_0058de89;
              }
            }
            uniformInformations.
            super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            uniformInformations.
            super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            uniformInformations.
            super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (uVar9 < 4) {
              if (loopCountType - LOOPCOUNT_UNIFORM < 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar13,"layout(std140, set=0, binding=",0x1e);
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)psVar13);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,") uniform buff",0xe);
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," {\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar13," ${COUNTER_PRECISION} int ",0x1a);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"ui_three",8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,";\n",2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"};\n",3);
                vertTemplate.m_template._M_dataplus._M_p._0_4_ = 7;
                if (uniformInformations.
                    super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    uniformInformations.
                    super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  *uniformInformations.
                   super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                   ._M_impl.super__Vector_impl_data._M_finish = UI_THREE;
                  goto LAB_0058e152;
                }
                std::vector<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>::
                _M_realloc_insert<vkt::sr::BaseUniformType>
                          (&uniformInformations,
                           (iterator)
                           uniformInformations.
                           super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (BaseUniformType *)&vertTemplate);
              }
            }
            else {
              if (loopCountType - LOOPCOUNT_UNIFORM < 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar13,"layout(std140, set=0, binding=",0x1e);
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)psVar13);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,") uniform buff",0xe);
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," {\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar13,"\t${COUNTER_PRECISION} float ",0x1c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"uf_third",8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,";\n",2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"};\n",3);
                vertTemplate.m_template._M_dataplus._M_p._0_4_ = 0x2d;
                if (uniformInformations.
                    super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    uniformInformations.
                    super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>::
                  _M_realloc_insert<vkt::sr::BaseUniformType>
                            (&uniformInformations,
                             (iterator)
                             uniformInformations.
                             super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (BaseUniformType *)&vertTemplate);
                }
                else {
                  *uniformInformations.
                   super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                   ._M_impl.super__Vector_impl_data._M_finish = UF_THIRD;
                  uniformInformations.
                  super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       uniformInformations.
                       super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar13,"layout(std140, set=0, binding=",0x1e);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)psVar13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,") uniform buff",0xe);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," {\n",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar13,"\t${COUNTER_PRECISION} float uf_one;\n",0x24);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"};\n",3);
              vertTemplate.m_template._M_dataplus._M_p._0_4_ = 0x24;
              if (uniformInformations.
                  super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  uniformInformations.
                  super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>::
                _M_realloc_insert<vkt::sr::BaseUniformType>
                          (&uniformInformations,
                           (iterator)
                           uniformInformations.
                           super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (BaseUniformType *)&vertTemplate);
              }
              else {
                *uniformInformations.
                 super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                 ._M_impl.super__Vector_impl_data._M_finish = UF_ONE;
LAB_0058e152:
                uniformInformations.
                super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     uniformInformations.
                     super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"void main()\n",0xc);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"void main()\n",0xc)
            ;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
            psVar19 = (string *)&frag;
            if (lVar22 == 0) {
              psVar19 = (string *)&vtx;
            }
            pcVar14 = "\t${PRECISION} vec4 coords = v_coords;\n";
            if (lVar22 == 0) {
              pcVar14 = "\t${PRECISION} vec4 coords = a_coords;\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar19,pcVar14,0x26);
            if (lVar8 == 2) {
              bVar24 = lVar22 == 0;
              psVar19 = (string *)&frag;
              if (bVar24) {
                psVar19 = (string *)&vtx;
              }
              pcVar14 = "\t${COUNTER_PRECISION} int one = int(v_one + 0.5);\n";
              if (bVar24) {
                pcVar14 = "\t${COUNTER_PRECISION} int one = int(a_one + 0.5);\n";
              }
              pcVar15 = "\t${COUNTER_PRECISION} float one = v_one;\n";
              if (bVar24) {
                pcVar15 = "\t${COUNTER_PRECISION} float one = a_one;\n";
              }
              if (uVar9 < 4) {
                pcVar15 = pcVar14;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar19,pcVar15,(ulong)(uVar9 < 4) * 9 + 0x29);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)psVar13,"\t${PRECISION} vec4 res = coords;\n",0x21);
            iterMaxStr._M_dataplus._M_p = (pointer)&iterMaxStr.field_2;
            iterMaxStr._M_string_length = 0;
            iterMaxStr.field_2._M_allocated_capacity =
                 iterMaxStr.field_2._M_allocated_capacity & 0xffffffffffffff00;
            if (uVar9 < 4) {
              if (loopCountType == LOOPCOUNT_UNIFORM) {
                std::__cxx11::string::_M_replace((ulong)&iterMaxStr,0,(char *)0x0,0xb1cf87);
                pcVar15 = "0";
              }
              else {
                if (loopCountType == LOOPCOUNT_CONSTANT) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vertTemplate);
                  std::ostream::operator<<((ostringstream *)&vertTemplate,3);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertTemplate);
                  std::ios_base::~ios_base(local_5d8);
                  std::__cxx11::string::operator=((string *)&iterMaxStr,(string *)&params);
                }
                else {
                  pcVar15 = "0";
                  if (lVar8 != 2) goto LAB_0058e4ab;
                  params._M_t._M_impl._0_8_ =
                       &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)0x65657268745f6975;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       (_Base_ptr)
                       ((ulong)params._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
                       0xffffffffffffff00);
                  plVar4 = (long *)std::__cxx11::string::append((char *)&params);
                  paVar10 = &vertTemplate.m_template.field_2;
                  psVar11 = (size_type *)(plVar4 + 2);
                  if ((size_type *)*plVar4 == psVar11) {
                    vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                    vertTemplate.m_template.field_2._8_8_ = plVar4[3];
                    vertTemplate.m_template._M_dataplus._M_p = (pointer)paVar10;
                  }
                  else {
                    vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                    vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
                  }
                  vertTemplate.m_template._M_string_length = plVar4[1];
                  *plVar4 = (long)psVar11;
                  plVar4[1] = 0;
                  *(undefined1 *)(plVar4 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&iterMaxStr,(string *)&vertTemplate);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)vertTemplate.m_template._M_dataplus._M_p != paVar10) {
                    operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                    vertTemplate.m_template.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                    &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                  operator_delete((void *)params._M_t._M_impl._0_8_,
                                  (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header._M_parent)->_M_color + 1));
                }
                pcVar15 = "0";
              }
            }
            else {
              if (loopCountType == LOOPCOUNT_CONSTANT) {
                pcVar14 = "1.0";
              }
              else if (loopCountType == LOOPCOUNT_UNIFORM) {
                pcVar14 = "uf_one";
              }
              else {
                pcVar14 = "uf_one*one";
                pcVar15 = "0.05";
                if (lVar8 != 2) goto LAB_0058e4ab;
              }
              std::__cxx11::string::_M_replace((ulong)&iterMaxStr,0,(char *)0x0,(ulong)pcVar14);
              pcVar15 = "0.05";
            }
LAB_0058e4ab:
            initValue._M_dataplus._M_p = (pointer)&initValue.field_2;
            sVar7 = strlen(pcVar15);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&initValue,pcVar15,pcVar15 + sVar7);
            std::operator+(&loopCountDeclStr,"${COUNTER_PRECISION} ${LOOP_VAR_TYPE} ndx = ",
                           &initValue);
            std::operator+(&loopCmpStr,"ndx < ",&iterMaxStr);
            incrementStr._M_dataplus._M_p = (pointer)&incrementStr.field_2;
            incrementStr._M_string_length = 0;
            incrementStr.field_2._M_local_buf[0] = '\0';
            if (uVar9 < 4) {
              std::__cxx11::string::_M_replace((ulong)&incrementStr,0,(char *)0x0,0xb1bc12);
            }
            else {
              if (loopCountType == LOOPCOUNT_UNIFORM) {
                params._M_t._M_impl._0_8_ =
                     &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x203d2b2078646e;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 7;
                params._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                plVar4 = (long *)std::__cxx11::string::append((char *)&params);
                paVar10 = &vertTemplate.m_template.field_2;
                psVar11 = (size_type *)(plVar4 + 2);
                if ((size_type *)*plVar4 == psVar11) {
                  vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                  vertTemplate.m_template.field_2._8_8_ = plVar4[3];
                  vertTemplate.m_template._M_dataplus._M_p = (pointer)paVar10;
                }
                else {
                  vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                  vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
                }
                vertTemplate.m_template._M_string_length = plVar4[1];
                *plVar4 = (long)psVar11;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                std::__cxx11::string::operator=((string *)&incrementStr,(string *)&vertTemplate);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vertTemplate.m_template._M_dataplus._M_p != paVar10) {
                  operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                  vertTemplate.m_template.field_2._M_allocated_capacity + 1);
                }
                p_Var18 = params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                _Var20._M_p = (pointer)params._M_t._M_impl._0_8_;
                if ((_Base_ptr *)params._M_t._M_impl._0_8_ ==
                    &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                goto LAB_0058e946;
              }
              else {
                if (loopCountType == LOOPCOUNT_CONSTANT) {
                  loopBody._M_dataplus._M_p = (pointer)&loopBody.field_2;
                  loopBody.field_2._M_local_buf[0] = 'n';
                  loopBody.field_2._M_allocated_capacity._1_2_ = 0x7864;
                  loopBody.field_2._M_allocated_capacity._3_4_ = 0x203d2b20;
                  loopBody._M_string_length = 7;
                  loopBody.field_2._M_local_buf[7] = '\0';
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vertTemplate);
                  std::ostream::_M_insert<double>(0.3333333432674408);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertTemplate);
                  std::ios_base::~ios_base(local_5d8);
                  uVar16 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)loopBody._M_dataplus._M_p != &loopBody.field_2) {
                    uVar16 = CONCAT17(loopBody.field_2._M_local_buf[7],
                                      CONCAT43(loopBody.field_2._M_allocated_capacity._3_4_,
                                               CONCAT21(loopBody.field_2._M_allocated_capacity._1_2_
                                                        ,loopBody.field_2._M_local_buf[0])));
                  }
                  if (uVar16 < fragTemplate.m_template._M_string_length + loopBody._M_string_length)
                  {
                    uVar17 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)fragTemplate.m_template._M_dataplus._M_p !=
                        &fragTemplate.m_template.field_2) {
                      uVar17 = fragTemplate.m_template.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar17 <
                        fragTemplate.m_template._M_string_length + loopBody._M_string_length)
                    goto LAB_0058e643;
                    puVar5 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&fragTemplate,0,(char *)0x0,
                                        (ulong)loopBody._M_dataplus._M_p);
                  }
                  else {
LAB_0058e643:
                    puVar5 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&loopBody,
                                        (ulong)fragTemplate.m_template._M_dataplus._M_p);
                  }
                  params._M_t._M_impl._0_8_ =
                       &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  puVar1 = puVar5 + 2;
                  if ((undefined8 *)*puVar5 == puVar1) {
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)*puVar1;
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         (_Base_ptr)puVar5[3];
                  }
                  else {
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)*puVar1;
                    params._M_t._M_impl._0_8_ = (undefined8 *)*puVar5;
                  }
                  params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar5[1];
                  *puVar5 = puVar1;
                  puVar5[1] = 0;
                  *(undefined1 *)puVar1 = 0;
                  std::__cxx11::string::operator=((string *)&incrementStr,(string *)&params);
                  if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                      &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                    operator_delete((void *)params._M_t._M_impl._0_8_,
                                    (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header.
                                                    _M_header._M_parent)->_M_color + 1));
                  }
                  uVar17 = fragTemplate.m_template.field_2._M_allocated_capacity;
                  _Var20._M_p = fragTemplate.m_template._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)fragTemplate.m_template._M_dataplus._M_p !=
                      &fragTemplate.m_template.field_2) {
LAB_0058e922:
                    operator_delete(_Var20._M_p,(ulong)((long)&((_Base_ptr)uVar17)->_M_color + 1));
                  }
                }
                else {
                  if (lVar8 != 2) goto LAB_0058e946;
                  loopBody._M_dataplus._M_p = (pointer)&loopBody.field_2;
                  loopBody.field_2._M_local_buf[0] = 'n';
                  loopBody.field_2._M_allocated_capacity._1_2_ = 0x7864;
                  loopBody.field_2._M_allocated_capacity._3_4_ = 0x203d2b20;
                  loopBody._M_string_length = 7;
                  loopBody.field_2._M_local_buf[7] = '\0';
                  plVar4 = (long *)std::__cxx11::string::append((char *)&loopBody);
                  params._M_t._M_impl._0_8_ =
                       &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  plVar12 = plVar4 + 2;
                  if ((long *)*plVar4 == plVar12) {
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)*plVar12;
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         (_Base_ptr)plVar4[3];
                  }
                  else {
                    params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)*plVar12;
                    params._M_t._M_impl._0_8_ = (long *)*plVar4;
                  }
                  params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar4[1];
                  *plVar4 = (long)plVar12;
                  plVar4[1] = 0;
                  *(undefined1 *)(plVar4 + 2) = 0;
                  plVar4 = (long *)std::__cxx11::string::append((char *)&params);
                  paVar10 = &vertTemplate.m_template.field_2;
                  psVar11 = (size_type *)(plVar4 + 2);
                  if ((size_type *)*plVar4 == psVar11) {
                    vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                    vertTemplate.m_template.field_2._8_8_ = plVar4[3];
                    vertTemplate.m_template._M_dataplus._M_p = (pointer)paVar10;
                  }
                  else {
                    vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                    vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
                  }
                  vertTemplate.m_template._M_string_length = plVar4[1];
                  *plVar4 = (long)psVar11;
                  plVar4[1] = 0;
                  *(undefined1 *)(plVar4 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&incrementStr,(string *)&vertTemplate);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)vertTemplate.m_template._M_dataplus._M_p != paVar10) {
                    operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                    vertTemplate.m_template.field_2._M_allocated_capacity + 1);
                  }
                  uVar17 = params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  _Var20._M_p = (pointer)params._M_t._M_impl._0_8_;
                  if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                      &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                  goto LAB_0058e922;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)loopBody._M_dataplus._M_p == &loopBody.field_2) goto LAB_0058e946;
                p_Var18 = (_Base_ptr)
                          CONCAT17(loopBody.field_2._M_local_buf[7],
                                   CONCAT43(loopBody.field_2._M_allocated_capacity._3_4_,
                                            CONCAT21(loopBody.field_2._M_allocated_capacity._1_2_,
                                                     loopBody.field_2._M_local_buf[0])));
                _Var20._M_p = loopBody._M_dataplus._M_p;
              }
              operator_delete(_Var20._M_p,(ulong)((long)&p_Var18->_M_color + 1));
            }
LAB_0058e946:
            loopBody._M_dataplus._M_p = (pointer)&loopBody.field_2;
            loopBody._M_string_length = 0;
            loopBody.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_replace((ulong)&loopBody,0,(char *)0x0,0xb1c39f);
            iVar3 = (int)local_4c0;
            if (iVar3 == 2) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"\t",1);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vertTemplate,loopCountDeclStr._M_dataplus._M_p,
                         loopCountDeclStr._M_dataplus._M_p + loopCountDeclStr._M_string_length);
              std::__cxx11::string::append((char *)&vertTemplate);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar13,vertTemplate.m_template._M_dataplus._M_p,
                         vertTemplate.m_template._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"\tdo\n",4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"\t{\n",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar13,loopBody._M_dataplus._M_p,loopBody._M_string_length);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\t\t",&incrementStr);
              plVar4 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar11 = (size_type *)(plVar4 + 2);
              if ((size_type *)*plVar4 == psVar11) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                vertTemplate.m_template.field_2._8_8_ = plVar4[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
              }
              vertTemplate.m_template._M_string_length = plVar4[1];
              *plVar4 = (long)psVar11;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar13,vertTemplate.m_template._M_dataplus._M_p,
                         vertTemplate.m_template._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\t} while (",&loopCmpStr);
              plVar4 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar11 = (size_type *)(plVar4 + 2);
              if ((size_type *)*plVar4 == psVar11) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                vertTemplate.m_template.field_2._8_8_ = plVar4[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
              }
              vertTemplate.m_template._M_string_length = plVar4[1];
              *plVar4 = (long)psVar11;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar13,vertTemplate.m_template._M_dataplus._M_p,
                         vertTemplate.m_template._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
            }
            else {
              if (iVar3 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"\t",1);
                vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2
                ;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&vertTemplate,loopCountDeclStr._M_dataplus._M_p,
                           loopCountDeclStr._M_dataplus._M_p + loopCountDeclStr._M_string_length);
                std::__cxx11::string::append((char *)&vertTemplate);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar13,vertTemplate.m_template._M_dataplus._M_p,
                           vertTemplate.m_template._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2)
                {
                  operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                  vertTemplate.m_template.field_2._M_allocated_capacity + 1);
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,"\twhile (",&loopCmpStr);
                plVar4 = (long *)std::__cxx11::string::append((char *)&params);
                vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2
                ;
                psVar11 = (size_type *)(plVar4 + 2);
                if ((size_type *)*plVar4 == psVar11) {
                  vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                  vertTemplate.m_template.field_2._8_8_ = plVar4[3];
                }
                else {
                  vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                  vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
                }
                vertTemplate.m_template._M_string_length = plVar4[1];
                *plVar4 = (long)psVar11;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar13,vertTemplate.m_template._M_dataplus._M_p,
                           vertTemplate.m_template._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2)
                {
                  operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                  vertTemplate.m_template.field_2._M_allocated_capacity + 1);
                }
                if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                    &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                  operator_delete((void *)params._M_t._M_impl._0_8_,
                                  (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header._M_parent)->_M_color + 1));
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"\t{\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar13,loopBody._M_dataplus._M_p,loopBody._M_string_length);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,"\t\t",&incrementStr);
                plVar4 = (long *)std::__cxx11::string::append((char *)&params);
                vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2
                ;
                psVar11 = (size_type *)(plVar4 + 2);
                if ((size_type *)*plVar4 == psVar11) {
                  vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                  vertTemplate.m_template.field_2._8_8_ = plVar4[3];
                }
                else {
                  vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                  vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
                }
                vertTemplate.m_template._M_string_length = plVar4[1];
                *plVar4 = (long)psVar11;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar13,vertTemplate.m_template._M_dataplus._M_p,
                           vertTemplate.m_template._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2)
                {
                  operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                  vertTemplate.m_template.field_2._M_allocated_capacity + 1);
                }
                if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                    &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                  operator_delete((void *)params._M_t._M_impl._0_8_,
                                  (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header._M_parent)->_M_color + 1));
                }
              }
              else {
                if (iVar3 != 0) goto LAB_0058f200;
                std::operator+(&local_340,"\tfor (",&loopCountDeclStr);
                plVar4 = (long *)std::__cxx11::string::append((char *)&local_340);
                local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
                psVar11 = (size_type *)(plVar4 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar4 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_4b8.field_2._M_allocated_capacity = *psVar11;
                  local_4b8.field_2._8_8_ = plVar4[3];
                }
                else {
                  local_4b8.field_2._M_allocated_capacity = *psVar11;
                  local_4b8._M_dataplus._M_p = (pointer)*plVar4;
                }
                local_4b8._M_string_length = plVar4[1];
                *plVar4 = (long)psVar11;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                plVar4 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_4b8,(ulong)loopCmpStr._M_dataplus._M_p);
                vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
                psVar11 = (size_type *)(plVar4 + 2);
                if ((size_type *)*plVar4 == psVar11) {
                  vertexShaderSource.field_2._M_allocated_capacity = *psVar11;
                  vertexShaderSource.field_2._8_8_ = plVar4[3];
                }
                else {
                  vertexShaderSource.field_2._M_allocated_capacity = *psVar11;
                  vertexShaderSource._M_dataplus._M_p = (pointer)*plVar4;
                }
                vertexShaderSource._M_string_length = plVar4[1];
                *plVar4 = (long)psVar11;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                plVar4 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
                fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2
                ;
                psVar11 = (size_type *)(plVar4 + 2);
                if ((size_type *)*plVar4 == psVar11) {
                  fragTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                  fragTemplate.m_template.field_2._8_8_ = plVar4[3];
                }
                else {
                  fragTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                  fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
                }
                fragTemplate.m_template._M_string_length = plVar4[1];
                *plVar4 = (long)psVar11;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                plVar4 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&fragTemplate,
                                            (ulong)incrementStr._M_dataplus._M_p);
                params._M_t._M_impl._0_8_ =
                     &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                plVar12 = plVar4 + 2;
                if ((long *)*plVar4 == plVar12) {
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)*plVar12;
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar4[3]
                  ;
                }
                else {
                  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)*plVar12;
                  params._M_t._M_impl._0_8_ = (long *)*plVar4;
                }
                params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar4[1];
                *plVar4 = (long)plVar12;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                plVar4 = (long *)std::__cxx11::string::append((char *)&params);
                vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2
                ;
                psVar11 = (size_type *)(plVar4 + 2);
                if ((size_type *)*plVar4 == psVar11) {
                  vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                  vertTemplate.m_template.field_2._8_8_ = plVar4[3];
                }
                else {
                  vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
                  vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
                }
                vertTemplate.m_template._M_string_length = plVar4[1];
                *plVar4 = (long)psVar11;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar13,vertTemplate.m_template._M_dataplus._M_p,
                           vertTemplate.m_template._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2)
                {
                  operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                  vertTemplate.m_template.field_2._M_allocated_capacity + 1);
                }
                if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                    &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                  operator_delete((void *)params._M_t._M_impl._0_8_,
                                  (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header._M_parent)->_M_color + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2)
                {
                  operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                  fragTemplate.m_template.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                  operator_delete(vertexShaderSource._M_dataplus._M_p,
                                  vertexShaderSource.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
                  operator_delete(local_4b8._M_dataplus._M_p,
                                  local_4b8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != &local_340.field_2) {
                  operator_delete(local_340._M_dataplus._M_p,
                                  local_340.field_2._M_allocated_capacity + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"\t{\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar13,loopBody._M_dataplus._M_p,loopBody._M_string_length);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,"\t}\n",3);
            }
LAB_0058f200:
            if (lVar22 == 0) {
              lVar21 = 0x23;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tv_color = res.rgb;\n",0x14);
              pcVar14 = "\to_color = vec4(v_color.rgb, 1.0);\n";
              psVar13 = (string *)&frag;
LAB_0058f269:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar13,pcVar14,lVar21);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"\to_color = vec4(res.rgb, 1.0);\n",0x1f);
              lVar21 = 0x10;
              pcVar14 = "\tv_one = a_one;\n";
              psVar13 = (string *)&vtx;
              if (lVar8 == 2) goto LAB_0058f269;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[14],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [14])"LOOP_VAR_TYPE",(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_628._M_p != local_618) {
              operator_delete(local_628._M_p,local_618[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])0xb1bc97,(char (*) [8])0xb5805a);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_628._M_p != local_618) {
              operator_delete(local_628._M_p,local_618[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            fragTemplate.m_template._M_dataplus._M_p = glu::getPrecisionName(precision);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[18],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [18])"COUNTER_PRECISION",(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_628._M_p != local_618) {
              operator_delete(local_628._M_p,local_618[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
              operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                              fragTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
            tcu::StringTemplate::specialize(&local_4b8,&fragTemplate,&params);
            this_00 = (LoopUniformSetup *)operator_new(0x28);
            LoopUniformSetup::LoopUniformSetup(this_00,&uniformInformations);
            node_02 = (TestNode *)operator_new(0xe0);
            ShaderLoopCase::ShaderLoopCase
                      ((ShaderLoopCase *)node_02,pTVar2,&local_360,&local_380,lVar22 == 0,
                       evalLoop3Iters,(UniformSetup *)this_00,&vertexShaderSource,&local_4b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
              operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            tcu::StringTemplate::~StringTemplate(&fragTemplate);
            tcu::StringTemplate::~StringTemplate(&vertTemplate);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&params._M_t);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopBody._M_dataplus._M_p != &loopBody.field_2) {
              operator_delete(loopBody._M_dataplus._M_p,
                              CONCAT17(loopBody.field_2._M_local_buf[7],
                                       CONCAT43(loopBody.field_2._M_allocated_capacity._3_4_,
                                                CONCAT21(loopBody.field_2._M_allocated_capacity.
                                                         _1_2_,loopBody.field_2._M_local_buf[0]))) +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)incrementStr._M_dataplus._M_p != &incrementStr.field_2) {
              operator_delete(incrementStr._M_dataplus._M_p,
                              CONCAT71(incrementStr.field_2._M_allocated_capacity._1_7_,
                                       incrementStr.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopCmpStr._M_dataplus._M_p != &loopCmpStr.field_2) {
              operator_delete(loopCmpStr._M_dataplus._M_p,
                              loopCmpStr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopCountDeclStr._M_dataplus._M_p != &loopCountDeclStr.field_2) {
              operator_delete(loopCountDeclStr._M_dataplus._M_p,
                              loopCountDeclStr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)initValue._M_dataplus._M_p != &initValue.field_2) {
              operator_delete(initValue._M_dataplus._M_p,initValue.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)iterMaxStr._M_dataplus._M_p != &iterMaxStr.field_2) {
              operator_delete(iterMaxStr._M_dataplus._M_p,
                              iterMaxStr.field_2._M_allocated_capacity + 1);
            }
            if (uniformInformations.
                super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(uniformInformations.
                              super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)uniformInformations.
                                    super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)uniformInformations.
                                    super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
            std::ios_base::~ios_base(local_138);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
            std::ios_base::~ios_base(local_2b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            tcu::TestNode::addChild(node_01,node_02);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)testDesc._M_dataplus._M_p != &testDesc.field_2) {
              operator_delete(testDesc._M_dataplus._M_p,testDesc.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)testName._M_dataplus._M_p != &testName.field_2) {
              operator_delete(testName._M_dataplus._M_p,testName.field_2._M_allocated_capacity + 1);
            }
            lVar22 = lVar22 + 4;
          } while (lVar22 == 4);
          bVar24 = lVar23 == 0;
          lVar23 = lVar23 + 1;
        } while (bVar24);
        precision = precision + PRECISION_MEDIUMP;
      } while (precision != PRECISION_LAST);
      lVar23 = 0;
      do {
        if (lVar23 != 7 || local_4c0 != 2) {
          pcVar14 = (&sr::(anonymous_namespace)::
                      getLoopCaseName(vkt::sr::(anonymous_namespace)::LoopCase)::s_names)[lVar23];
          lVar22 = 0;
          do {
            glu::getShaderTypeName(*(ShaderType *)((long)init::s_shaderTypes + lVar22));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&frag,pcVar14,(allocator<char> *)&params);
            plVar4 = (long *)std::__cxx11::string::append((char *)&frag);
            _vtx = (pointer)local_310;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar10) {
              local_310[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_310[0]._8_8_ = plVar4[3];
            }
            else {
              local_310[0]._0_8_ = paVar10->_M_allocated_capacity;
              _vtx = (pointer)*plVar4;
            }
            *plVar4 = (long)paVar10;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&vtx);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar11 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar11) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
              vertTemplate.m_template.field_2._8_8_ = plVar4[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar11;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar4;
            }
            vertTemplate.m_template._M_string_length = plVar4[1];
            *plVar4 = (long)psVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_vtx != local_310) {
              operator_delete(_vtx,local_310[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_frag != local_198) {
              operator_delete(_frag,local_198[0]._M_allocated_capacity + 1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&loopCountDeclStr,pcVar14,(allocator<char> *)&loopCmpStr);
            plVar4 = (long *)std::__cxx11::string::append((char *)&loopCountDeclStr);
            initValue._M_dataplus._M_p = (pointer)&initValue.field_2;
            psVar11 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar11) {
              initValue.field_2._M_allocated_capacity = *psVar11;
              initValue.field_2._8_8_ = plVar4[3];
            }
            else {
              initValue.field_2._M_allocated_capacity = *psVar11;
              initValue._M_dataplus._M_p = (pointer)*plVar4;
            }
            initValue._M_string_length = plVar4[1];
            *plVar4 = (long)psVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&initValue);
            iterMaxStr._M_dataplus._M_p = (pointer)&iterMaxStr.field_2;
            psVar11 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar11) {
              iterMaxStr.field_2._M_allocated_capacity = *psVar11;
              iterMaxStr.field_2._8_8_ = plVar4[3];
            }
            else {
              iterMaxStr.field_2._M_allocated_capacity = *psVar11;
              iterMaxStr._M_dataplus._M_p = (pointer)*plVar4;
            }
            iterMaxStr._M_string_length = plVar4[1];
            *plVar4 = (long)psVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&iterMaxStr);
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            plVar12 = plVar4 + 2;
            if ((long *)*plVar4 == plVar12) {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar4[3];
            }
            else {
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
              params._M_t._M_impl._0_8_ = (long *)*plVar4;
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar4[1];
            *plVar4 = (long)plVar12;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&params);
            _frag = (pointer)local_198;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar10) {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar4[3];
            }
            else {
              local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
              _frag = (pointer)*plVar4;
            }
            *plVar4 = (long)paVar10;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&frag);
            _vtx = (pointer)local_310;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar10) {
              local_310[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_310[0]._8_8_ = plVar4[3];
            }
            else {
              local_310[0]._0_8_ = paVar10->_M_allocated_capacity;
              _vtx = (pointer)*plVar4;
            }
            *plVar4 = (long)paVar10;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_frag != local_198) {
              operator_delete(_frag,local_198[0]._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)iterMaxStr._M_dataplus._M_p != &iterMaxStr.field_2) {
              operator_delete(iterMaxStr._M_dataplus._M_p,
                              iterMaxStr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)initValue._M_dataplus._M_p != &initValue.field_2) {
              operator_delete(initValue._M_dataplus._M_p,initValue.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopCountDeclStr._M_dataplus._M_p != &loopCountDeclStr.field_2) {
              operator_delete(loopCountDeclStr._M_dataplus._M_p,
                              loopCountDeclStr.field_2._M_allocated_capacity + 1);
            }
            pTVar2 = (local_4c8->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&frag,vertTemplate.m_template._M_dataplus._M_p,
                       (allocator<char> *)&initValue);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,_vtx,(allocator<char> *)&loopCountDeclStr);
            createSpecialLoopCase
                      ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                        *)&iterMaxStr,pTVar2,(string *)&frag,(string *)&params,lVar22 == 0,
                       (LoopCase)lVar23,(LoopType)local_4c0,loopCountType);
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_frag != local_198) {
              operator_delete(_frag,local_198[0]._M_allocated_capacity + 1);
            }
            _Var20._M_p = iterMaxStr._M_dataplus._M_p;
            iterMaxStr._M_dataplus._M_p = (pointer)0x0;
            tcu::TestNode::addChild(local_4d0,(TestNode *)_Var20._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_vtx != local_310) {
              operator_delete(_vtx,(ulong)(local_310[0]._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            lVar22 = lVar22 + 4;
          } while (lVar22 == 4);
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0x1a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)groupDesc._M_dataplus._M_p != &groupDesc.field_2) {
        operator_delete(groupDesc._M_dataplus._M_p,groupDesc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)groupName._M_dataplus._M_p != &groupName.field_2) {
        operator_delete(groupName._M_dataplus._M_p,groupName.field_2._M_allocated_capacity + 1);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    local_4c0 = local_4c0 + 1;
    if (local_4c0 == 3) {
      return 0xd25a50;
    }
  } while( true );
}

Assistant:

void ShaderLoopTests::init (void)
{
	// Loop cases.

	static const glu::ShaderType s_shaderTypes[] =
	{
		glu::SHADERTYPE_VERTEX,
		glu::SHADERTYPE_FRAGMENT
	};

	static const glu::DataType s_countDataType[] =
	{
		glu::TYPE_INT,
		glu::TYPE_FLOAT
	};

	TestCaseGroup* genericGroup = new TestCaseGroup(m_testCtx, "generic", "Generic loop tests.");
	TestCaseGroup* specialGroup = new TestCaseGroup(m_testCtx, "special", "Special loop tests.");
	addChild(genericGroup);
	addChild(specialGroup);

	for (int loopType = 0; loopType < LOOPTYPE_LAST; loopType++)
	{
		const char* loopTypeName = getLoopTypeName((LoopType)loopType);

		for (int loopCountType = 0; loopCountType < LOOPCOUNT_LAST; loopCountType++)
		{
			const char* loopCountName = getLoopCountTypeName((LoopCountType)loopCountType);

			std::string groupName = std::string(loopTypeName) + "_" + std::string(loopCountName) + "_iterations";
			std::string groupDesc = std::string("Loop tests with ") + loopCountName + " loop counter.";
			TestCaseGroup* genericSubGroup = new TestCaseGroup(m_testCtx, groupName.c_str(), groupDesc.c_str());
			TestCaseGroup* specialSubGroup = new TestCaseGroup(m_testCtx, groupName.c_str(), groupDesc.c_str());
			genericGroup->addChild(genericSubGroup);
			specialGroup->addChild(specialSubGroup);

			// Generic cases.

			for (int precision = glu::PRECISION_MEDIUMP; precision < glu::PRECISION_LAST; precision++)
			{
				const char* precisionName = getPrecisionName((glu::Precision)precision);

				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_countDataType); dataTypeNdx++)
				{
					glu::DataType loopDataType = s_countDataType[dataTypeNdx];
					const char* dataTypeName = getDataTypeName(loopDataType);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						glu::ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char*	shaderTypeName	= getShaderTypeName(shaderType);
						bool		isVertexCase	= (shaderType == glu::SHADERTYPE_VERTEX);

						std::string testName = std::string("basic_") + precisionName + "_" + dataTypeName + "_" + shaderTypeName;
						std::string testDesc = std::string(loopTypeName) + " loop with " + precisionName + dataTypeName + " " + loopCountName + " iteration count in " + shaderTypeName + " shader.";
						de::MovePtr<ShaderLoopCase> testCase(createGenericLoopCase(m_testCtx, testName.c_str(), testDesc.c_str(), isVertexCase, (LoopType)loopType, (LoopCountType)loopCountType, (glu::Precision)precision, loopDataType));
						genericSubGroup->addChild(testCase.release());
					}
				}
			}

			// Special cases.

			for (int loopCase = 0; loopCase < LOOPCASE_LAST; loopCase++)
			{
				const char* loopCaseName = getLoopCaseName((LoopCase)loopCase);

				// no-iterations not possible with do-while.
				if ((loopCase == LOOPCASE_NO_ITERATIONS) && (loopType == LOOPTYPE_DO_WHILE))
					continue;

				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					glu::ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					bool		isVertexCase	= (shaderType == glu::SHADERTYPE_VERTEX);

					std::string name = std::string(loopCaseName) + "_" + shaderTypeName;
					std::string desc = std::string(loopCaseName) + " loop with " + loopTypeName + " iteration count in " + shaderTypeName + " shader.";
					de::MovePtr<ShaderLoopCase> testCase(createSpecialLoopCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, (LoopCase)loopCase, (LoopType)loopType, (LoopCountType)loopCountType));
					specialSubGroup->addChild(testCase.release());
				}
			}
		}
	}
}